

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba.h
# Opt level: O2

void ClownLZSS::Internal::Gba::EncodeMatches<std::ofstream>
               (uchar *data,Matches *matches,size_t total_matches,
               CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output)

{
  uint uVar1;
  ClownLZSS_Match *match;
  ClownLZSS_Match *match_00;
  long lVar2;
  DescriptorFieldWriter<decltype(output)> descriptor_bits;
  
  BitField::
  DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
  ::DescriptorFieldWriter(&descriptor_bits,output);
  match_00 = (matches->_M_t).
             super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
             super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
             super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl;
  for (lVar2 = total_matches * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    if (match_00->source == match_00->destination + 1) {
      BitField::
      WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
      ::Push(&descriptor_bits.
              super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
             ,false);
      OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
      ::WriteImplementation
                (&output->
                  super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 ,data[match_00->destination]);
    }
    else {
      BitField::
      WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
      ::Push(&descriptor_bits.
              super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
             ,true);
      uVar1 = EncodeMatch(match_00);
      OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
      ::Write<2U,_(ClownLZSS::Internal::Endian)1>
                ((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                  *)output,(ulong)uVar1);
    }
    match_00 = match_00 + 1;
  }
  BitField::
  DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
  ::~DescriptorFieldWriter(&descriptor_bits);
  return;
}

Assistant:

void EncodeMatches(const unsigned char* const data, const Matches& matches, std::size_t total_matches, CompressorOutput<T> &output)
			{
				DescriptorFieldWriter<decltype(output)> descriptor_bits(output);
				for (const auto& match : std::ranges::subrange(&matches[0], &matches[total_matches]))
				{
					if (CLOWNLZSS_MATCH_IS_LITERAL(&match))
					{
						descriptor_bits.Push(0);
						output.Write(data[match.destination]);
					}
					else
					{
						descriptor_bits.Push(1);
						output.WriteLE16(EncodeMatch(match));
					}
				}
			}